

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::finalizeAsync(Federate *this)

{
  pointer p_Var1;
  _Result<void> *p_Var2;
  InvalidFunctionCall *this_00;
  _State_baseV2 *__tmp;
  _State_baseV2 *__tmp_1;
  string_view message;
  __allocator_type __a2;
  __state_type local_98;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_88;
  __allocator_type __a2_1;
  thread local_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __basic_future<void> local_58;
  handle asyncInfo;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "Async function calls and methods are not allowed for single thread federates";
    message._M_len = 0x4c;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  switch((this->currentMode)._M_i) {
  case FINALIZE:
  case ERROR_STATE:
  case PENDING_FINALIZE:
    goto switchD_001fa159_caseD_3;
  case PENDING_INIT:
    enterInitializingModeComplete(this);
    break;
  case PENDING_EXEC:
    enterExecutingModeComplete(this);
    break;
  case PENDING_TIME:
    requestTimeComplete(this);
    break;
  case PENDING_ITERATIVE_TIME:
    requestTimeIterativeComplete(this);
  }
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (&asyncInfo,
             (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl);
  LOCK();
  (this->currentMode)._M_i = PENDING_FINALIZE;
  UNLOCK();
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pointer)operator_new(0x50);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_004d3858;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  local_88._M_alloc = &__a2;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_004d38a8;
  local_88._M_ptr = p_Var1;
  p_Var2 = (_Result<void> *)operator_new(0x10);
  *(undefined8 *)p_Var2 = 0;
  *(undefined8 *)&p_Var2->field_0x8 = 0;
  std::__future_base::_Result<void>::_Result(p_Var2);
  *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = p_Var2;
  *(Federate **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = this;
  local_70._M_id._M_thread = (id)0;
  ___a2_1 = (long *)operator_new(0x20);
  *___a2_1 = (long)&PTR___State_004d3900;
  ___a2_1[1] = (long)&p_Var1->_M_impl;
  ___a2_1[2] = (long)std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>
                     ::_M_run;
  ___a2_1[3] = 0;
  std::thread::_M_start_thread(&local_70,&__a2_1,0);
  if (___a2_1 != (long *)0x0) {
    (**(code **)(*___a2_1 + 8))();
  }
  CLI::std::thread::operator=
            ((thread *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20),&local_70);
  CLI::std::thread::~thread(&local_70);
  local_88._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_88);
  local_68 = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  local_88._M_ptr =
       (pointer)local_98.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&p_Var1->_M_impl;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var1 = (pointer)operator_new(0x40);
    local_88._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)&__a2_1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_004d3940;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_004d3990;
    local_88._M_ptr = p_Var1;
    p_Var2 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var2 = 0;
    *(undefined8 *)&p_Var2->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var2);
    *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = p_Var2;
    *(Federate **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = this;
    local_88._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_88);
    local_68 = 0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:839:25)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_98.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88._M_ptr =
         (pointer)local_98.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var1->_M_impl;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  }
  std::__basic_future<void>::__basic_future(&local_58,&local_98);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_98.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<void>::operator=(&(asyncInfo.data)->finalizeFuture,(future<void> *)&local_58);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_58._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
switchD_001fa159_caseD_3:
  return;
}

Assistant:

void Federate::finalizeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    switch (currentMode) {
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::PENDING_EXEC:
            enterExecutingModeComplete();
            break;
        case Modes::PENDING_TIME:
            requestTimeComplete();
            break;
        case Modes::PENDING_ITERATIVE_TIME:
            requestTimeIterativeComplete();
            break;
        case Modes::FINALIZE:
        case Modes::ERROR_STATE:
        case Modes::PENDING_FINALIZE:
            return;
            // do nothing
        default:
            break;
    }
    auto finalizeFunc = [this]() { return coreObject->finalize(fedID); };
    auto asyncInfo = asyncCallInfo->lock();
    updateFederateMode(Modes::PENDING_FINALIZE);
    asyncInfo->finalizeFuture = std::async(std::launch::async, finalizeFunc);
}